

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ActivationParams * __thiscall
CoreML::Specification::SimpleRecurrentLayerParams::mutable_activation
          (SimpleRecurrentLayerParams *this)

{
  ActivationParams *this_00;
  SimpleRecurrentLayerParams *this_local;
  
  if (this->activation_ == (ActivationParams *)0x0) {
    this_00 = (ActivationParams *)operator_new(0x20);
    ActivationParams::ActivationParams(this_00);
    this->activation_ = this_00;
  }
  return this->activation_;
}

Assistant:

inline ::CoreML::Specification::ActivationParams* SimpleRecurrentLayerParams::mutable_activation() {
  
  if (activation_ == NULL) {
    activation_ = new ::CoreML::Specification::ActivationParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.SimpleRecurrentLayerParams.activation)
  return activation_;
}